

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O1

QRegion __thiscall
QHeaderView::visualRegionForSelection(QHeaderView *this,QItemSelection *selection)

{
  QItemSelectionRange *pQVar1;
  QItemSelectionRange *pQVar2;
  QPersistentModelIndexData *pQVar3;
  uint logicalIndex;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long in_RDX;
  uint uVar10;
  QModelIndex *__return_storage_ptr__;
  long lVar11;
  long lVar12;
  const_iterator __begin3;
  QItemSelectionRange *this_00;
  long in_FS_OFFSET;
  bool bVar13;
  const_iterator __end3;
  QModelIndex local_68;
  undefined1 local_50 [12];
  Representation local_44;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (selection->super_QList<QItemSelectionRange>).d.ptr;
  bVar13 = *(int *)&pQVar2[0x54].br.d == 1;
  pQVar3 = pQVar2[0x2f].br.d;
  __return_storage_ptr__ = &local_68;
  if (bVar13) {
    __return_storage_ptr__ = (QModelIndex *)local_50;
  }
  QPersistentModelIndex::operator_cast_to_QModelIndex(__return_storage_ptr__,&pQVar2[0x3b].br);
  logicalIndex = (**(code **)(*(long *)pQVar3 + 0x78 + (ulong)bVar13 * 8))
                           (pQVar3,__return_storage_ptr__);
  this_00 = *(QItemSelectionRange **)(in_RDX + 8);
  lVar12 = *(long *)(in_RDX + 0x10);
  lVar11 = lVar12 * 0x10;
  pQVar1 = this_00 + lVar12;
  pQVar3 = pQVar2[0x56].br.d;
  if (*(int *)&pQVar2[0x54].br.d == 1) {
    if (pQVar3 == (QPersistentModelIndexData *)0x0) {
      if (lVar12 == 0) {
        uVar7 = 0;
      }
      else {
        lVar12 = lVar12 << 4;
        uVar7 = 0;
        do {
          QPersistentModelIndex::parent();
          if (((((int)local_50._0_4_ < 0) || ((int)local_50._4_4_ < 0)) ||
              (local_40.ptr == (QAbstractItemModel *)0x0)) &&
             (bVar13 = QItemSelectionRange::isValid(this_00), bVar13)) {
            iVar4 = QPersistentModelIndex::column();
            if (iVar4 < (int)logicalIndex) {
              logicalIndex = QPersistentModelIndex::column();
            }
            iVar4 = QPersistentModelIndex::column();
            if ((int)uVar7 < iVar4) {
              uVar7 = QPersistentModelIndex::column();
            }
          }
          this_00 = this_00 + 1;
          lVar12 = lVar12 + -0x10;
        } while (lVar12 != 0);
      }
    }
    else {
      uVar10 = 0;
      if (lVar12 != 0) {
        do {
          QPersistentModelIndex::parent();
          if (((((int)local_50._0_4_ < 0) || ((int)local_50._4_4_ < 0)) ||
              (local_40.ptr == (QAbstractItemModel *)0x0)) &&
             (bVar13 = QItemSelectionRange::isValid(this_00), bVar13)) {
            iVar4 = QPersistentModelIndex::column();
            iVar5 = QPersistentModelIndex::column();
            if (iVar4 <= iVar5) {
              do {
                uVar6 = visualIndex((QHeaderView *)selection,iVar4);
                uVar7 = logicalIndex;
                if ((int)uVar6 < (int)logicalIndex) {
                  uVar7 = uVar6;
                }
                uVar9 = uVar10;
                if ((int)uVar10 < (int)uVar6) {
                  uVar9 = uVar6;
                }
                if (uVar6 != 0xffffffff) {
                  logicalIndex = uVar7;
                  uVar10 = uVar9;
                }
                iVar5 = QPersistentModelIndex::column();
                bVar13 = iVar4 < iVar5;
                iVar4 = iVar4 + 1;
              } while (bVar13);
            }
          }
          this_00 = this_00 + 1;
        } while (this_00 != pQVar1);
      }
      pQVar2 = (selection->super_QList<QItemSelectionRange>).d.ptr;
      if ((int)logicalIndex < 0) {
        uVar7 = 0xffffffff;
      }
      else {
        iVar4 = *(int *)&pQVar2[0x65].tl.d;
        if (iVar4 == 0) {
          iVar5 = (int)pQVar2[0x65].br.d;
        }
        else {
          iVar5 = (int)pQVar2[100].br.d;
        }
        uVar7 = 0xffffffff;
        if ((int)logicalIndex < iVar5) {
          uVar7 = logicalIndex;
        }
        if (((iVar4 != 0) && ((int)logicalIndex < iVar5)) &&
           (uVar7 = logicalIndex, pQVar2[0x58].tl.d != (QPersistentModelIndexData *)0x0)) {
          uVar7 = *(uint *)(pQVar2[0x57].br.d + (ulong)logicalIndex * 4);
        }
      }
      logicalIndex = uVar7;
      iVar4 = *(int *)&pQVar2[0x65].tl.d;
      if (iVar4 == 0) {
        iVar5 = (int)pQVar2[0x65].br.d;
      }
      else {
        iVar5 = (int)pQVar2[100].br.d;
      }
      uVar7 = 0xffffffff;
      if ((int)uVar10 < iVar5) {
        uVar7 = uVar10;
      }
      if (((iVar4 != 0) && ((int)uVar10 < iVar5)) &&
         (uVar7 = uVar10, pQVar2[0x58].tl.d != (QPersistentModelIndexData *)0x0)) {
        uVar7 = *(uint *)(pQVar2[0x57].br.d + (ulong)uVar10 * 4);
      }
    }
    if ((((-1 < (int)logicalIndex) &&
         (iVar4 = count((QHeaderView *)selection), (int)logicalIndex < iVar4)) && (-1 < (int)uVar7))
       && (iVar4 = count((QHeaderView *)selection), (int)uVar7 < iVar4)) {
      iVar4 = sectionViewportPosition((QHeaderView *)selection,logicalIndex);
      iVar5 = sectionViewportPosition((QHeaderView *)selection,uVar7);
      iVar8 = sectionSize((QHeaderView *)selection,uVar7);
      pQVar2 = selection[1].super_QList<QItemSelectionRange>.d.ptr;
      local_44.m_i = *(int *)&pQVar2[2].tl.d - *(int *)&pQVar2[1].br.d;
      local_50._4_4_ = 0;
      local_50._8_4_ = iVar8 + iVar5 + -1;
      local_50._0_4_ = iVar4;
LAB_0055c814:
      QRegion::QRegion((QRegion *)this,(QRect *)local_50,Rectangle);
      goto LAB_0055c832;
    }
  }
  else {
    if (pQVar3 == (QPersistentModelIndexData *)0x0) {
      if (lVar12 == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = 0;
        do {
          QPersistentModelIndex::parent();
          if (((((int)local_50._0_4_ < 0) || ((int)local_50._4_4_ < 0)) ||
              (local_40.ptr == (QAbstractItemModel *)0x0)) &&
             (bVar13 = QItemSelectionRange::isValid(this_00), bVar13)) {
            iVar4 = QPersistentModelIndex::row();
            if (iVar4 < (int)logicalIndex) {
              logicalIndex = QPersistentModelIndex::row();
            }
            iVar4 = QPersistentModelIndex::row();
            if ((int)uVar7 < iVar4) {
              uVar7 = QPersistentModelIndex::row();
            }
          }
          this_00 = this_00 + 1;
          lVar11 = lVar11 + -0x10;
        } while (lVar11 != 0);
      }
    }
    else {
      uVar10 = 0;
      if (lVar12 != 0) {
        do {
          QPersistentModelIndex::parent();
          if (((((int)local_50._0_4_ < 0) || ((int)local_50._4_4_ < 0)) ||
              (local_40.ptr == (QAbstractItemModel *)0x0)) &&
             (bVar13 = QItemSelectionRange::isValid(this_00), bVar13)) {
            iVar4 = QPersistentModelIndex::row();
            iVar5 = QPersistentModelIndex::row();
            if (iVar4 <= iVar5) {
              do {
                uVar6 = visualIndex((QHeaderView *)selection,iVar4);
                uVar7 = logicalIndex;
                if ((int)uVar6 < (int)logicalIndex) {
                  uVar7 = uVar6;
                }
                uVar9 = uVar10;
                if ((int)uVar10 < (int)uVar6) {
                  uVar9 = uVar6;
                }
                if (uVar6 != 0xffffffff) {
                  uVar10 = uVar9;
                  logicalIndex = uVar7;
                }
                iVar5 = QPersistentModelIndex::row();
                bVar13 = iVar4 < iVar5;
                iVar4 = iVar4 + 1;
              } while (bVar13);
            }
          }
          this_00 = this_00 + 1;
        } while (this_00 != pQVar1);
      }
      pQVar2 = (selection->super_QList<QItemSelectionRange>).d.ptr;
      if ((int)logicalIndex < 0) {
        uVar7 = 0xffffffff;
      }
      else {
        iVar4 = *(int *)&pQVar2[0x65].tl.d;
        if (iVar4 == 0) {
          iVar5 = (int)pQVar2[0x65].br.d;
        }
        else {
          iVar5 = (int)pQVar2[100].br.d;
        }
        uVar7 = 0xffffffff;
        if ((int)logicalIndex < iVar5) {
          uVar7 = logicalIndex;
        }
        if (((iVar4 != 0) && ((int)logicalIndex < iVar5)) &&
           (uVar7 = logicalIndex, pQVar2[0x58].tl.d != (QPersistentModelIndexData *)0x0)) {
          uVar7 = *(uint *)(pQVar2[0x57].br.d + (ulong)logicalIndex * 4);
        }
      }
      logicalIndex = uVar7;
      iVar4 = *(int *)&pQVar2[0x65].tl.d;
      if (iVar4 == 0) {
        iVar5 = (int)pQVar2[0x65].br.d;
      }
      else {
        iVar5 = (int)pQVar2[100].br.d;
      }
      uVar7 = 0xffffffff;
      if ((int)uVar10 < iVar5) {
        uVar7 = uVar10;
      }
      if (((iVar4 != 0) && ((int)uVar10 < iVar5)) &&
         (uVar7 = uVar10, pQVar2[0x58].tl.d != (QPersistentModelIndexData *)0x0)) {
        uVar7 = *(uint *)(pQVar2[0x57].br.d + (ulong)uVar10 * 4);
      }
    }
    if (((-1 < (int)logicalIndex) &&
        (iVar4 = count((QHeaderView *)selection), (int)logicalIndex < iVar4)) &&
       ((-1 < (int)uVar7 && (iVar4 = count((QHeaderView *)selection), (int)uVar7 < iVar4)))) {
      iVar4 = sectionViewportPosition((QHeaderView *)selection,logicalIndex);
      iVar5 = sectionViewportPosition((QHeaderView *)selection,uVar7);
      iVar8 = sectionSize((QHeaderView *)selection,uVar7);
      pQVar2 = selection[1].super_QList<QItemSelectionRange>.d.ptr;
      local_50._8_4_ = *(int *)((long)&pQVar2[1].br.d + 4) - *(int *)((long)&pQVar2[1].tl.d + 4);
      local_50._0_4_ = 0;
      local_44.m_i = iVar8 + iVar5 + -1;
      local_50._4_4_ = iVar4;
      goto LAB_0055c814;
    }
  }
  QRegion::QRegion((QRegion *)this);
LAB_0055c832:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QHeaderView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QHeaderView);
    const int max = d->modelSectionCount();

    if (d->orientation == Qt::Horizontal) {
        int logicalLeft = max;
        int logicalRight = 0;

        if (d->visualIndices.empty()) {
            // If no reordered sections, skip redundant visual-to-logical transformations
            for (const auto &r : selection) {
                if (r.parent().isValid() || !r.isValid())
                    continue; // we only know about toplevel items and we don't want invalid ranges
                if (r.left() < logicalLeft)
                    logicalLeft = r.left();
                if (r.right() > logicalRight)
                    logicalRight = r.right();
            }
        } else {
            int left = max;
            int right = 0;
            for (const auto &r : selection) {
                if (r.parent().isValid() || !r.isValid())
                    continue; // we only know about toplevel items and we don't want invalid ranges
                for (int k = r.left(); k <= r.right(); ++k) {
                    int visual = visualIndex(k);
                    if (visual == -1)   // in some cases users may change the selections
                        continue;       // before we have a chance to do the layout
                    if (visual < left)
                        left = visual;
                    if (visual > right)
                        right = visual;
                }
            }
            logicalLeft = logicalIndex(left);
            logicalRight = logicalIndex(right);
        }

        if (logicalLeft < 0  || logicalLeft >= count() ||
            logicalRight < 0 || logicalRight >= count())
            return QRegion();

        int leftPos = sectionViewportPosition(logicalLeft);
        int rightPos = sectionViewportPosition(logicalRight);
        rightPos += sectionSize(logicalRight);
        return QRect(leftPos, 0, rightPos - leftPos, height());
    }
    // orientation() == Qt::Vertical
    int logicalTop = max;
    int logicalBottom = 0;

    if (d->visualIndices.empty()) {
        // If no reordered sections, skip redundant visual-to-logical transformations
        for (const auto &r : selection) {
            if (r.parent().isValid() || !r.isValid())
                continue; // we only know about toplevel items and we don't want invalid ranges
            if (r.top() < logicalTop)
                logicalTop = r.top();
            if (r.bottom() > logicalBottom)
                logicalBottom = r.bottom();
        }
    } else {
        int top = max;
        int bottom = 0;

        for (const auto &r : selection) {
            if (r.parent().isValid() || !r.isValid())
                continue; // we only know about toplevel items and we don't want invalid ranges
            for (int k = r.top(); k <= r.bottom(); ++k) {
                int visual = visualIndex(k);
                if (visual == -1)   // in some cases users may change the selections
                    continue;       // before we have a chance to do the layout
                if (visual < top)
                    top = visual;
                if (visual > bottom)
                    bottom = visual;
            }
        }

        logicalTop = logicalIndex(top);
        logicalBottom = logicalIndex(bottom);
    }

    if (logicalTop < 0 || logicalTop >= count() ||
        logicalBottom < 0 || logicalBottom >= count())
        return QRegion();

    int topPos = sectionViewportPosition(logicalTop);
    int bottomPos = sectionViewportPosition(logicalBottom) + sectionSize(logicalBottom);

    return QRect(0, topPos, width(), bottomPos - topPos);
}